

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

bool __thiscall
SQCompilation::CheckerVisitor::isPotentiallyNullable
          (CheckerVisitor *this,Expr *e,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited)

{
  ValueRefState VVar1;
  bool bVar2;
  TreeOp TVar3;
  LiteralKind LVar4;
  _Node_iterator_base<const_SQCompilation::Expr_*,_false> visited_00;
  ValueRef *pVVar5;
  CheckerVisitor *this_00;
  LiteralExpr *this_01;
  AccessExpr *this_02;
  Node *this_03;
  Id *this_04;
  GetFieldExpr *this_05;
  Expr *pEVar6;
  Expr *in_RDX;
  void *extraout_RDX;
  Expr **in_RDI;
  TerExpr *t;
  Expr *callee;
  SQChar *funcName;
  CallExpr *call;
  LiteralExpr *l;
  ValueRef *v;
  iterator existed;
  unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
  *in_stack_ffffffffffffff90;
  SQChar *local_60;
  _Node_iterator_base<const_SQCompilation::Expr_*,_false> local_30;
  CheckerVisitor *pCVar7;
  bool local_1;
  
  deparen((Expr *)in_stack_ffffffffffffff78);
  visited_00._M_cur =
       (__node_type *)
       std::
       unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x19617e);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
       ::end(in_stack_ffffffffffffff78);
  bVar2 = std::__detail::operator!=
                    ((_Node_iterator_base<const_SQCompilation::Expr_*,_false> *)
                     &stack0xffffffffffffffd8,&local_30);
  if (bVar2) {
    return false;
  }
  std::
  unordered_set<SQCompilation::Expr_const*,std::hash<SQCompilation::Expr_const*>,std::equal_to<SQCompilation::Expr_const*>,std::allocator<SQCompilation::Expr_const*>>
  ::emplace<SQCompilation::Expr_const*&>(in_stack_ffffffffffffff90,in_RDI);
  pVVar5 = findValueForExpr((CheckerVisitor *)funcName,callee);
  if (pVVar5 != (ValueRef *)0x0) {
    if ((pVVar5->flagsPositive & 2) != 0) {
      return true;
    }
    if ((pVVar5->flagsNegative & 2) != 0) {
      return false;
    }
    if ((pVVar5->state == VRS_UNDEFINED) || (pVVar5->state == VRS_PARTIALLY)) {
      return true;
    }
  }
  this_00 = (CheckerVisitor *)
            maybeEval((CheckerVisitor *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (Expr *)in_stack_ffffffffffffff78,false);
  TVar3 = Node::op((Node *)this_00);
  if (TVar3 == TO_LITERAL) {
    this_01 = Expr::asLiteral((Expr *)this_00);
    LVar4 = LiteralExpr::kind(this_01);
    return LVar4 == LK_NULL;
  }
  bVar2 = Expr::isAccessExpr((Expr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (bVar2) {
    this_02 = Expr::asAccessExpr((Expr *)this_00);
    bVar2 = AccessExpr::isNullable(this_02);
    if (bVar2) {
      return true;
    }
  }
  TVar3 = Node::op((Node *)this_00);
  if (TVar3 == TO_CALL) {
    pCVar7 = this_00;
    bVar2 = CallExpr::isNullable((CallExpr *)this_00);
    if (bVar2) {
      return true;
    }
    local_60 = (SQChar *)0x0;
    this_03 = &CallExpr::callee((CallExpr *)this_00)->super_Node;
    TVar3 = Node::op(this_03);
    if (TVar3 == TO_ID) {
      this_04 = Node::asId(this_03);
      local_60 = Id::id(this_04);
      this_00 = pCVar7;
    }
    else {
      TVar3 = Node::op(this_03);
      this_00 = pCVar7;
      if (TVar3 == TO_GETFIELD) {
        this_05 = Node::asGetField(this_03);
        local_60 = FieldAccessExpr::fieldName(&this_05->super_FieldAccessExpr);
        this_00 = pCVar7;
      }
    }
    if ((local_60 != (SQChar *)0x0) && (bVar2 = canFunctionReturnNull((SQChar *)0x196384), bVar2)) {
      return true;
    }
  }
  TVar3 = Node::op((Node *)this_00);
  if (TVar3 == TO_NULLC) {
    BinExpr::rhs((BinExpr *)this_00);
    local_1 = isPotentiallyNullable
                        (this_00,in_RDX,
                         (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                          *)visited_00._M_cur);
  }
  else {
    TVar3 = Node::op((Node *)this_00);
    if (TVar3 == TO_TERNARY) {
      pCVar7 = this_00;
      pEVar6 = TerExpr::b((TerExpr *)this_00);
      bVar2 = isPotentiallyNullable
                        (pCVar7,in_RDX,
                         (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                          *)visited_00._M_cur);
      local_1 = true;
      if (!bVar2) {
        TerExpr::c((TerExpr *)this_00,pEVar6,extraout_RDX);
        local_1 = isPotentiallyNullable
                            (pCVar7,in_RDX,
                             (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                              *)visited_00._M_cur);
      }
    }
    else {
      pVVar5 = findValueForExpr((CheckerVisitor *)funcName,callee);
      if (pVVar5 == (ValueRef *)0x0) {
        local_1 = false;
      }
      else {
        VVar1 = pVVar5->state;
        if (VVar1 != VRS_UNDEFINED) {
          if (VVar1 - VRS_EXPRESSION < 2) {
            bVar2 = isPotentiallyNullable
                              (this_00,in_RDX,
                               (unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
                                *)visited_00._M_cur);
            return bVar2;
          }
          if (VVar1 != VRS_PARTIALLY) {
            return false;
          }
        }
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool CheckerVisitor::isPotentiallyNullable(const Expr *e, std::unordered_set<const Expr *> &visited) {

  e = deparen(e);

  auto existed = visited.find(e);
  if (existed != visited.end()) {
    return false;
  }

  visited.emplace(e);

  const ValueRef *v = findValueForExpr(e);

  if (v) {
    if (v->flagsPositive & RT_NULL)
      return true;

    if (v->flagsNegative & RT_NULL)
      return false;

    if (v->state == VRS_UNDEFINED || v->state == VRS_PARTIALLY)
      return true;
  }

  e = maybeEval(e);

  if (e->op() == TO_LITERAL) {
    const LiteralExpr *l = e->asLiteral();
    return l->kind() == LK_NULL;
  }

  if (e->isAccessExpr()) {
    if (e->asAccessExpr()->isNullable()) {
      return true;
    }
  }

  if (e->op() == TO_CALL) {
    const CallExpr *call = static_cast<const CallExpr *>(e);
    if (call->isNullable()) {
      return true;
    }

    const SQChar *funcName = nullptr;
    const Expr *callee = call->callee();

    if (callee->op() == TO_ID) {
      funcName = callee->asId()->id();
    }
    else if (callee->op() == TO_GETFIELD) {
      funcName = callee->asGetField()->fieldName();
    }

    if (funcName) {
      if (canFunctionReturnNull(funcName)) {
        return true;
      }
    }
  }

  if (e->op() == TO_NULLC) {
    return isPotentiallyNullable(static_cast<const BinExpr *>(e)->rhs(), visited);
  }

  if (e->op() == TO_TERNARY) {
    const TerExpr *t = static_cast<const TerExpr *>(e);
    return isPotentiallyNullable(t->b(), visited) || isPotentiallyNullable(t->c(), visited);
  }

  v = findValueForExpr(e);

  if (v) {
    switch (v->state)
    {
    case VRS_EXPRESSION:
    case VRS_INITIALIZED:
      return isPotentiallyNullable(v->expression, visited);
    case VRS_UNDEFINED:
    case VRS_PARTIALLY:
      return true;
    default:
      return false;
    }
  }

  return false;
}